

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerivedModule.h
# Opt level: O0

ResultType * __thiscall
Scine::Core::DerivedModule::detail::ListModels::operator()
          (ListModels *this,
          pair<Scine::Core::DummyInterface,_boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>
          *param_2)

{
  size_type in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>
  *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *models;
  vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>
  *pvVar1;
  anon_class_8_1_616f5ba8 in_stack_ffffffffffffffd0;
  
  pvVar1 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x126619);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(in_RSI,in_RDX);
  boost::mpl::operator()(in_stack_ffffffffffffffd0,pvVar1,(make_identity<mpl_::arg<1>_> *)pvVar1);
  return (ResultType *)in_RDI;
}

Assistant:

ResultType operator()(PairType* /* model */ = 0) const {
    using ModelTypeList = typename boost::mpl::second<PairType>::type;

    std::vector<std::string> models;
    models.reserve(boost::mpl::size<ModelTypeList>::value);
    // "Iterate" through this entry's list of model types
    boost::mpl::for_each<ModelTypeList, boost::mpl::make_identity<boost::mpl::_1>>([&](auto t) {
      using ModelType = typename decltype(t)::type;
      models.push_back(ModelType::model);
    });

    return models;
  }